

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

void __thiscall toml::Value::Value(Value *this,string *v)

{
  string *this_00;
  
  this->type_ = STRING_TYPE;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string((string *)this_00,(string *)v);
  (this->field_1).string_ = this_00;
  return;
}

Assistant:

Value(const std::string& v) : type_(STRING_TYPE), string_(new std::string(v)) {}